

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this,Geometry *level_0_geom,AmrInfo *amr_info)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_00;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_01;
  int iVar1;
  pointer pIVar2;
  long lVar3;
  int lev;
  long lVar4;
  long lVar5;
  size_type __new_size;
  AmrInfo def_amr_info;
  Geometry r;
  
  AmrInfo::AmrInfo(&this->super_AmrInfo,amr_info);
  this->_vptr_AmrMesh = (_func_int **)&PTR__AmrMesh_007d4a58;
  this_01 = &this->geom;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_setdm = 0;
  this->num_setba = 0;
  iVar1 = (this->super_AmrInfo).max_level;
  AmrInfo::AmrInfo(&def_amr_info);
  __new_size = (long)iVar1 + 1;
  this_00 = &(this->super_AmrInfo).ref_ratio;
  pIVar2 = (amr_info->ref_ratio).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->ref_ratio).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar2) {
    pIVar2 = def_amr_info.ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,
             pIVar2 + -1);
  pIVar2 = (amr_info->blocking_factor).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
           .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->blocking_factor).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar2) {
    pIVar2 = def_amr_info.blocking_factor.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar2 + -1);
  pIVar2 = (amr_info->max_grid_size).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->max_grid_size).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar2) {
    pIVar2 = def_amr_info.max_grid_size.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).max_grid_size.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar2 + -1);
  pIVar2 = (amr_info->n_error_buf).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->n_error_buf).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar2) {
    pIVar2 = def_amr_info.n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).n_error_buf.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar2 + -1);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            (&(this->dmap).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             __new_size);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             __new_size);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::reserve
            (&this_01->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,__new_size);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
            (&this_01->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,level_0_geom)
  ;
  lVar3 = 0;
  lVar5 = 0;
  for (lVar4 = 1; lVar4 <= (this->super_AmrInfo).max_level; lVar4 = lVar4 + 1) {
    pIVar2 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy(&r,(void *)((long)(((this_01->
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                      lVar5 + 0xfffffffffffffff8U),200);
    Geometry::refine(&r,(IntVect *)((long)pIVar2->vect + lVar3));
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::emplace_back<amrex::Geometry>
              (&this_01->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,&r);
    lVar5 = lVar5 + 200;
    lVar3 = lVar3 + 0xc;
  }
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = 0xffffffff;
  if ((this->super_AmrInfo).check_input != false) {
    checkInput(this);
  }
  AmrInfo::~AmrInfo(&def_amr_info);
  return;
}

Assistant:

AmrMesh::AmrMesh (Geometry const& level_0_geom, AmrInfo const& amr_info)
    : AmrInfo(amr_info)
{
    int nlev = max_level + 1;
    AmrInfo def_amr_info;
    ref_ratio.resize      (nlev, amr_info.ref_ratio.empty()
                           ? def_amr_info.ref_ratio.back()
                           :     amr_info.ref_ratio.back());
    blocking_factor.resize(nlev, amr_info.blocking_factor.empty()
                           ? def_amr_info.blocking_factor.back()
                           :     amr_info.blocking_factor.back());
    max_grid_size.resize  (nlev, amr_info.max_grid_size.empty()
                           ? def_amr_info.max_grid_size.back()
                           :     amr_info.max_grid_size.back());
    n_error_buf.resize    (nlev, amr_info.n_error_buf.empty()
                           ? def_amr_info.n_error_buf.back()
                           :     amr_info.n_error_buf.back());

    dmap.resize(nlev);
    grids.resize(nlev);
    geom.reserve(nlev);
    geom.push_back(level_0_geom);
    for (int lev = 1; lev <= max_level; ++lev) {
        geom.push_back(amrex::refine(geom[lev-1], ref_ratio[lev-1]));
    }

    finest_level = -1;

    if (check_input) checkInput();
}